

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test264.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint32_t uVar1;
  int iVar2;
  h264_seqparm *phVar3;
  h264_picparm *phVar4;
  h264_slice *slice_00;
  h264_macroblock *phVar5;
  bitstream *str_00;
  bitstream *nstr;
  int infer_cbp;
  int mbt;
  int kk;
  int tt [4];
  int x;
  int k;
  int j;
  int i;
  h264_slice *slice;
  h264_picparm *picparm;
  h264_seqparm *seqparm;
  bitstream *pbStack_28;
  uint32_t val;
  bitstream *str;
  FILE *out;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  str = (bitstream *)0x0;
  out = (FILE *)argv;
  argv_local._0_4_ = argc;
  if ((argc < 2) || (str = (bitstream *)fopen(argv[1],"w"), (FILE *)str != (FILE *)0x0)) {
    pbStack_28 = vs_new_encode(VS_H264);
    seqparm._4_4_ = 0xde;
    iVar2 = vs_start(pbStack_28,(uint32_t *)((long)&seqparm + 4));
    if (iVar2 == 0) {
      phVar3 = (h264_seqparm *)calloc(0xcd8,1);
      phVar4 = (h264_picparm *)calloc(0x8a8,1);
      slice_00 = (h264_slice *)calloc(0xc48,1);
      phVar3->frame_mbs_only_flag = 0;
      phVar3->direct_8x8_inference_flag = 0;
      phVar4->num_slice_groups_minus1 = 0;
      phVar4->constrained_intra_pred_flag = 0;
      phVar4->transform_8x8_mode_flag = 1;
      phVar4->entropy_coding_mode_flag = 1;
      slice_00->seqparm = phVar3;
      slice_00->picparm = phVar4;
      slice_00->sliceqpy = 0x1a;
      slice_00->pic_width_in_mbs = 8;
      slice_00->pic_size_in_mbs = slice_00->pic_width_in_mbs * 0x18;
      slice_00->first_mb_in_slice = 0;
      slice_00->nal_unit_type = 1;
      slice_00->slice_type = 0;
      slice_00->mbaff_frame_flag = 0;
      slice_00->field_pic_flag = 1;
      slice_00->cabac_init_idc = 2;
      slice_00->chroma_array_type = 1;
      slice_00->num_ref_idx_l0_active_minus1 = 0x1f;
      slice_00->num_ref_idx_l1_active_minus1 = 0x1f;
      slice_00->bit_depth_luma_minus8 = 0;
      slice_00->bit_depth_chroma_minus8 = 0;
      phVar5 = (h264_macroblock *)calloc(0x3774,(ulong)slice_00->pic_size_in_mbs);
      slice_00->mbs = phVar5;
      for (k = 0; k < 0x60; k = k + 1) {
        slice_00->mbs[k].mb_field_decoding_flag = k >> 2 & 1;
        slice_00->mbs[k].coded_block_pattern = (k * 3) % 0x30;
        slice_00->mbs[k].transform_size_8x8_flag = k & 1;
        slice_00->mbs[k].mb_qp_delta = k % 5 + -2;
        if (k < 0x10) {
          slice_00->mbs[k].mb_type = 0;
        }
        else if (k < 0x28) {
          slice_00->mbs[k].mb_type = k - 0xf;
        }
        else if ((k < 0x2c) || (slice_00->slice_type != 0)) {
          if ((k < 0x2c) || (slice_00->slice_type != 1)) {
            slice_00->mbs[k].mb_type = 0x19;
          }
          else if (k < 0x30) {
            slice_00->mbs[k].mb_type = 0x38;
          }
          else if (k < 0x48) {
            slice_00->mbs[k].mb_type = 0x38;
          }
          else {
            slice_00->mbs[k].mb_type = 0x38;
          }
        }
        else if (k < 0x30) {
          slice_00->mbs[k].mb_type = 0x20;
        }
        else if (k < 0x48) {
          tt[2] = (k + -0x30) / 8;
          slice_00->mbs[k].mb_type = tt[2] + 0x1b;
          if (tt[2] == 0) {
            for (x = 0; x < 4; x = x + 1) {
              slice_00->mbs[k].ref_idx[0][x] = (k & 7U) + 0xf;
            }
            for (x = 0; x < 0x10; x = x + 1) {
              slice_00->mbs[k].mvd[0][x][0] = -((k & 7U) + 3);
              slice_00->mbs[k].mvd[0][x][1] = k & 3;
            }
          }
          else if (tt[2] == 1) {
            for (x = 0; x < 4; x = x + 1) {
              slice_00->mbs[k].ref_idx[0][x] = (x >> 1) + 4;
            }
            for (x = 0; x < 0x10; x = x + 1) {
              slice_00->mbs[k].mvd[0][x][0] = (x >> 3) + 0xc;
              slice_00->mbs[k].mvd[0][x][1] = -(x >> 3);
            }
          }
          else if (tt[2] == 2) {
            for (x = 0; x < 4; x = x + 1) {
              slice_00->mbs[k].ref_idx[0][x] = (x & 1U) + 2;
            }
            for (x = 0; x < 0x10; x = x + 1) {
              slice_00->mbs[k].mvd[0][x][0] = (x >> 2 & 1U) + 6;
              slice_00->mbs[k].mvd[0][x][1] = -(x >> 2 & 1U);
            }
          }
        }
        else {
          slice_00->mbs[k].mb_type = 0x1e;
          slice_00->mbs[k].transform_size_8x8_flag = 0;
          for (x = 0; x < 4; x = x + 1) {
            slice_00->mbs[k].sub_mb_type[x] = x;
            slice_00->mbs[k].ref_idx[0][x] = x + 1;
            _mbt = 0x200000000;
            tt[0] = 1;
            tt[1] = 3;
            for (tt[3] = 0; tt[3] < 4; tt[3] = tt[3] + 1) {
              iVar2 = x * 4 + (tt[3] & (&mbt)[x]);
              slice_00->mbs[k].mvd[0][x * 4 + tt[3]][0] = iVar2 + 0x10;
              slice_00->mbs[k].mvd[0][x * 4 + tt[3]][1] = iVar2 + -0x20;
            }
          }
        }
        if ((slice_00->mbs[k].mb_type == 0) || (slice_00->mbs[k].mb_type == 0x1a)) {
          for (x = 0; x < 0x10; x = x + 1) {
            slice_00->mbs[k].prev_intra4x4_pred_mode_flag[x] = x & 1;
            slice_00->mbs[k].rem_intra4x4_pred_mode[x] = x >> 1;
          }
          for (x = 0; x < 4; x = x + 1) {
            slice_00->mbs[k].prev_intra8x8_pred_mode_flag[x] = x & 1;
            slice_00->mbs[k].rem_intra8x8_pred_mode[x] = x >> 1;
          }
        }
        if (slice_00->mbs[k].mb_type < 0x1b) {
          slice_00->mbs[k].intra_chroma_pred_mode = k >> 2 & 3;
        }
        if ((slice_00->mbs[k].mb_type == 0x20) || (slice_00->mbs[k].mb_type == 0x38)) {
          slice_00->mbs[k].mb_field_decoding_flag = 0;
          slice_00->mbs[k].coded_block_pattern = 0;
          slice_00->mbs[k].transform_size_8x8_flag = 0;
          slice_00->mbs[k].mb_qp_delta = 0;
          slice_00->mbs[k].intra_chroma_pred_mode = 0;
        }
        else if (slice_00->mbs[k].mb_type == 0x19) {
          slice_00->mbs[k].coded_block_pattern = 0x2f;
          slice_00->mbs[k].transform_size_8x8_flag = 0;
          slice_00->mbs[k].mb_qp_delta = 0;
          slice_00->mbs[k].intra_chroma_pred_mode = 0;
          for (x = 0; x < 0x100; x = x + 1) {
            if ((k & 1U) != 0) {
              slice_00->mbs[k].pcm_sample_chroma[x] = x;
            }
            if ((k & 2U) != 0) {
              slice_00->mbs[k].pcm_sample_luma[x] = x;
            }
          }
        }
        else {
          iVar2 = h264_is_intra_16x16_mb_type(slice_00->mbs[k].mb_type);
          if (iVar2 == 0) {
            if (slice_00->mbs[k].coded_block_pattern == 0) {
              slice_00->mbs[k].mb_qp_delta = 0;
            }
            for (x = 0; x < 0x10; x = x + 1) {
              if ((slice_00->mbs[k].coded_block_pattern >> ((byte)(x >> 2) & 0x1f) & 1) != 0) {
                for (tt[3] = 0; tt[3] < 0x10; tt[3] = tt[3] + 1) {
                  if (x != 0) {
                    slice_00->mbs[k].block_luma_4x4[0][x][tt[3]] = x * 0x10 + tt[3];
                    slice_00->mbs[k].block_luma_8x8[0][x >> 2][(int)((x & 3U) * 0x10 + tt[3])] =
                         x * 0x10 + tt[3];
                  }
                }
              }
            }
          }
          else {
            uVar1 = slice_00->mbs[k].mb_type;
            nstr._4_4_ = ((int)(uVar1 - 1) >> 2) % 3 << 4;
            if (0xc < (int)uVar1) {
              nstr._4_4_ = nstr._4_4_ | 0xf;
            }
            slice_00->mbs[k].coded_block_pattern = nstr._4_4_;
            slice_00->mbs[k].transform_size_8x8_flag = 0;
            for (x = 0; x < 0x10; x = x + 1) {
              slice_00->mbs[k].block_luma_dc[0][x] = x + 0x100;
              if ((slice_00->mbs[k].coded_block_pattern >> ((byte)(x >> 2) & 0x1f) & 1) != 0) {
                for (tt[3] = 0; tt[3] < 0xf; tt[3] = tt[3] + 1) {
                  if (x != 0) {
                    slice_00->mbs[k].block_luma_ac[0][x][tt[3]] = x * 0x10 + tt[3] + 1;
                  }
                }
              }
            }
          }
          if ((slice_00->mbs[k].coded_block_pattern & 0x30) != 0) {
            for (tt[3] = 0; tt[3] < 4; tt[3] = tt[3] + 1) {
              slice_00->mbs[k].block_chroma_dc[(int)(k & 1)][tt[3]] = tt[3] + -0x10;
            }
          }
          if ((slice_00->mbs[k].coded_block_pattern & 0x20) != 0) {
            for (x = 0; x < 4; x = x + 1) {
              for (tt[3] = 0; tt[3] < 0xf; tt[3] = tt[3] + 1) {
                if (x != 1) {
                  slice_00->mbs[k].block_chroma_ac[(int)(k >> 1 & 1)][x][tt[3]] =
                       tt[3] + -0x1000 + x * 0x100;
                }
              }
            }
          }
        }
        if (slice_00->mbaff_frame_flag == 0) {
          slice_00->mbs[k].mb_field_decoding_flag = slice_00->field_pic_flag;
        }
      }
      slice_00->last_mb_in_slice = k - 1;
      iVar2 = h264_slice_data(pbStack_28,slice_00);
      if (iVar2 == 0) {
        if (str != (bitstream *)0x0) {
          fwrite(pbStack_28->bytes,(long)pbStack_28->bytesnum,1,(FILE *)str);
        }
        str_00 = vs_new_decode(VS_H264,pbStack_28->bytes,pbStack_28->bytesnum);
        iVar2 = vs_start(str_00,(uint32_t *)((long)&seqparm + 4));
        if (iVar2 == 0) {
          if (seqparm._4_4_ == 0xde) {
            iVar2 = h264_slice_data(str_00,slice_00);
            if (iVar2 == 0) {
              h264_print_slice_data(slice_00);
              fprintf(_stderr,"All ok!\n");
              argv_local._4_4_ = 0;
            }
            else {
              h264_print_slice_data(slice_00);
              argv_local._4_4_ = 1;
            }
          }
          else {
            fprintf(_stderr,"Fail 1\n");
            argv_local._4_4_ = 1;
          }
        }
        else {
          argv_local._4_4_ = 1;
        }
      }
      else {
        argv_local._4_4_ = 1;
      }
    }
    else {
      argv_local._4_4_ = 1;
    }
  }
  else {
    perror("fopen");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	FILE *out = 0;
	if (argc >= 2) {
		out = fopen(argv[1], "w");
		if (!out) {
			perror("fopen");
			return 1;
		}
	}
	struct bitstream *str = vs_new_encode(VS_H264);
	uint32_t val;
	val = 0xde;
	if (vs_start(str, &val))
		return 1;

	struct h264_seqparm *seqparm = calloc(sizeof *seqparm, 1);
	struct h264_picparm *picparm = calloc(sizeof *picparm, 1);
	struct h264_slice *slice = calloc(sizeof *slice, 1);
	seqparm->frame_mbs_only_flag = 0;
	seqparm->direct_8x8_inference_flag = 0;
	picparm->num_slice_groups_minus1 = 0;
	picparm->constrained_intra_pred_flag = 0;
	picparm->transform_8x8_mode_flag = 1;
	picparm->entropy_coding_mode_flag = 1;
	slice->seqparm = seqparm;
	slice->picparm = picparm;
	slice->sliceqpy = 26;
	slice->pic_width_in_mbs = 8;
	slice->pic_size_in_mbs = slice->pic_width_in_mbs * 24;
	slice->first_mb_in_slice = 0;
	slice->nal_unit_type = 1;
	slice->slice_type = H264_SLICE_TYPE_P;
	slice->mbaff_frame_flag = 0;
	slice->field_pic_flag = 1;
	slice->cabac_init_idc = 2;
	slice->chroma_array_type = 1;
	slice->num_ref_idx_l0_active_minus1 = 31;
	slice->num_ref_idx_l1_active_minus1 = 31;
	slice->bit_depth_luma_minus8 = 0;
	slice->bit_depth_chroma_minus8 = 0;
	slice->mbs = calloc(sizeof *slice->mbs, slice->pic_size_in_mbs);
	int i, j, k;
	for (i = 0; i < 96; i++) {
		slice->mbs[i].mb_field_decoding_flag = i >> 2 & 1;
		slice->mbs[i].coded_block_pattern = i * 3 % 48;
		slice->mbs[i].transform_size_8x8_flag = i& 1;
		slice->mbs[i].mb_qp_delta = (i%5) - 2;
		if (i < 16) {
			slice->mbs[i].mb_type = 0;
		} else if (i < 40) {
			slice->mbs[i].mb_type = 1 + (i- 16);
		} else if (i >= 44 && slice->slice_type == H264_SLICE_TYPE_P) {
			if (i < 48) {
				slice->mbs[i].mb_type = H264_MB_TYPE_P_SKIP;
			} else if (i < 72) {
				int x = (i - 48)/8;
				slice->mbs[i].mb_type = H264_MB_TYPE_P_L0_16X16 + x;
				if (x == 0) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 15 + (i & 7);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = -((i & 7) + 3);
						slice->mbs[i].mvd[0][j][1] = (i&3);
					}
				} else if (x == 1) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 4 + (j >> 1);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = 12 + (j >> 3);
						slice->mbs[i].mvd[0][j][1] = -(j >> 3);
					}
				} else if (x == 2) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 2 + (j & 1);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = 6 + (j>>2 & 1);
						slice->mbs[i].mvd[0][j][1] = -(j>>2 & 1);
					}
				}
			} else {
				slice->mbs[i].mb_type = H264_MB_TYPE_P_8X8;
				slice->mbs[i].transform_size_8x8_flag = 0;
				for (j = 0; j < 4; j++) {
					slice->mbs[i].sub_mb_type[j] = j;
					slice->mbs[i].ref_idx[0][j] = j+1;
					int tt[4] = { 0, 2, 1, 3};
					for (k = 0; k < 4; k++) {
						int kk = j * 4 + (k & j[tt]);
						slice->mbs[i].mvd[0][j*4+k][0] = 16+kk;
						slice->mbs[i].mvd[0][j*4+k][1] = kk - 32;;
					}
				}
			}
		} else if (i >= 44 && slice->slice_type == H264_SLICE_TYPE_B) {
			if (i < 48) {
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			} else if (i < 72) {
				/* XXX */
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			} else {
				/* XXX */
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			}
		} else {
			slice->mbs[i].mb_type = H264_MB_TYPE_I_PCM;
		}
		if (slice->mbs[i].mb_type == H264_MB_TYPE_I_NXN || slice->mbs[i].mb_type == H264_MB_TYPE_SI) {
			for (j = 0; j < 16; j++) {
				slice->mbs[i].prev_intra4x4_pred_mode_flag[j] = j & 1;
				slice->mbs[i].rem_intra4x4_pred_mode[j] = j >> 1;
			}
			for (j = 0; j < 4; j++) {
				slice->mbs[i].prev_intra8x8_pred_mode_flag[j] = j & 1;
				slice->mbs[i].rem_intra8x8_pred_mode[j] = j >> 1;
			}
		}
		if (slice->mbs[i].mb_type < H264_MB_TYPE_P_BASE) {
			slice->mbs[i].intra_chroma_pred_mode = i >> 2 & 3;
		}
		if (slice->mbs[i].mb_type == H264_MB_TYPE_P_SKIP || slice->mbs[i].mb_type == H264_MB_TYPE_B_SKIP) {
			slice->mbs[i].mb_field_decoding_flag = 0;
			slice->mbs[i].coded_block_pattern = 0;
			slice->mbs[i].transform_size_8x8_flag = 0;
			slice->mbs[i].mb_qp_delta = 0;
			slice->mbs[i].intra_chroma_pred_mode = 0;
		} else if (slice->mbs[i].mb_type == H264_MB_TYPE_I_PCM) {
			slice->mbs[i].coded_block_pattern = 0x2f;
			slice->mbs[i].transform_size_8x8_flag = 0;
			slice->mbs[i].mb_qp_delta = 0;
			slice->mbs[i].intra_chroma_pred_mode = 0;
			for (j = 0; j < 256; j++) {
				if (i & 1)
					slice->mbs[i].pcm_sample_chroma[j] = j;
				if (i & 2)
					slice->mbs[i].pcm_sample_luma[j] = j;
			}
		} else {
			if (h264_is_intra_16x16_mb_type(slice->mbs[i].mb_type)) {
				int mbt = slice->mbs[i].mb_type;
				int infer_cbp = (((mbt - H264_MB_TYPE_I_16X16_0_0_0) >> 2) % 3) << 4;
				if (mbt >= H264_MB_TYPE_I_16X16_0_0_1)
					infer_cbp |= 0xf;
				slice->mbs[i].coded_block_pattern = infer_cbp;
				slice->mbs[i].transform_size_8x8_flag = 0;
				for (j = 0; j < 16; j++) {
					slice->mbs[i].block_luma_dc[0][j] = 0x100 + j;
					if (slice->mbs[i].coded_block_pattern >> (j >> 2) & 1) {
						for (k = 0; k < 15; k++) {
							if (j) {
								slice->mbs[i].block_luma_ac[0][j][k] = j * 16 + k + 1;
							}
						}
					}
				}
			} else {
				if (!slice->mbs[i].coded_block_pattern)
					slice->mbs[i].mb_qp_delta = 0;
				for (j = 0; j < 16; j++) {
					if (slice->mbs[i].coded_block_pattern >> (j >> 2) & 1) {
						for (k = 0; k < 16; k++) {
							if (j) {
								slice->mbs[i].block_luma_4x4[0][j][k] = j * 16 + k;
								slice->mbs[i].block_luma_8x8[0][j>>2][(j&3)*16+k] = j*16 + k;
							}
						}
					}
				}
			}
			if (slice->mbs[i].coded_block_pattern & 0x30) {
				for (k = 0; k < 4; k++) {
					slice->mbs[i].block_chroma_dc[i&1][k] = -0x10 + k;
				}
			}
			if (slice->mbs[i].coded_block_pattern & 0x20) {
				for (j = 0; j < 4; j++) {
					for (k = 0; k < 15; k++) {
						if (j != 1)
							slice->mbs[i].block_chroma_ac[i>>1&1][j][k] = k - 0x1000 + j * 0x100;
					}
				}
			}
		}
		if (!slice->mbaff_frame_flag)
			slice->mbs[i].mb_field_decoding_flag = slice->field_pic_flag;
	}
	slice->last_mb_in_slice = i - 1;
	
	if (h264_slice_data(str, slice)) return 1;

	if (out)
		fwrite(str->bytes, str->bytesnum, 1, out);

	struct bitstream *nstr = vs_new_decode(VS_H264, str->bytes, str->bytesnum);
	if (vs_start(nstr, &val))
		return 1;
	if (val != 0xde) {
		fprintf (stderr, "Fail 1\n");
		return 1;
	}
	if (h264_slice_data(nstr, slice)) {
		h264_print_slice_data(slice);
		return 1;
	}
	h264_print_slice_data(slice);

	fprintf (stderr, "All ok!\n");

	return 0;
}